

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Matrix<double,__1,_1,_0,__1,_1> *pMVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  size_t in_RCX;
  int i;
  uint uVar3;
  ulong uVar4;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  ppm_image image;
  
  local_78.m_xpr._0_4_ = 0x100;
  local_90 = (Scalar)CONCAT44(local_90._4_4_,0x100);
  sisl::utility::ppm_image::ppm_image(&image,(int *)&local_78,(int *)&local_90);
  for (uVar3 = 0; uVar3 != 10; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; (int)uVar4 != 10; uVar4 = (ulong)((int)uVar4 + 1)) {
      pMVar1 = sisl::
               array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::operator()(&image.m_aArray,uVar3,uVar4);
      local_90 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
                (&local_78,pMVar1,&local_90);
      local_80 = 0.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_78,&local_80);
      local_88 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_88);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_78);
    }
  }
  for (uVar3 = 10; uVar3 != 0x14; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; (int)uVar4 != 10; uVar4 = (ulong)((int)uVar4 + 1)) {
      pMVar1 = sisl::
               array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::operator()(&image.m_aArray,uVar3,uVar4);
      local_90 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
                (&local_78,pMVar1,&local_90);
      local_80 = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_78,&local_80);
      local_88 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_88);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_78);
    }
  }
  for (uVar3 = 0x14; uVar3 != 0x1e; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; (int)uVar4 != 10; uVar4 = (ulong)((int)uVar4 + 1)) {
      pMVar1 = sisl::
               array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::operator()(&image.m_aArray,uVar3,uVar4);
      local_90 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
                (&local_78,pMVar1,&local_90);
      local_80 = 0.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_78,&local_80);
      local_88 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_88);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_78);
    }
  }
  std::__cxx11::string::string((string *)&local_78,"200_output.ppm",(allocator *)&local_90);
  sisl::utility::ppm_image::write(&image,(int)&local_78,(void *)0x1,in_RCX);
  std::__cxx11::string::~string((string *)&local_78);
  sisl::
  array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~array_n(&image.m_aArray);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	// The most simple way to output an image
	// in sisl, is to create a ppm image object
	sisl::utility::ppm_image image(256, 256);


	// then fill in its cells with pixel rgb values
	// images start at 0,0 top left
	
	// square 1
	for(int i = 0; i < 10; i++)
		for(int j = 0; j < 10; j++) {
			image(i,j) << 1.0, 0.0, 0.0; // all red
		}

	// square 2
	for(int i = 10; i < 20; i++)
		for(int j = 0; j < 10; j++) {
			image(i,j) << 0.0, 1.0, 0.0; // all green
		}

	// square 3
	for(int i = 20; i < 30; i++)
		for(int j = 0; j < 10; j++) {
			image(i,j) << 0.0, 0.0, 1.0; // all blue
		}

	image.write("200_output.ppm");
	return 0;
}